

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

gs_val_t *
golf_script_eval_fn(gs_val_t *__return_storage_ptr__,golf_script_t *script,char *name,gs_val_t *args
                   ,int num_args)

{
  gs_env_t **ppgVar1;
  _Bool _Var2;
  int iVar3;
  gs_val_t *pgVar4;
  gs_val_t local_c8;
  gs_val_t local_b0;
  gs_val_type local_94;
  char *pcStack_90;
  gs_val_type type;
  char *symbol;
  undefined1 auStack_80 [4];
  int i;
  anon_union_16_10_4eabebd3_for_gs_val_2 local_78;
  long local_68;
  gs_stmt_t *fn_stmt;
  anon_union_16_10_4eabebd3_for_gs_val_2 local_58;
  undefined1 local_48 [8];
  gs_val_t fn_val;
  gs_env_t *env;
  int num_args_local;
  gs_val_t *args_local;
  char *name_local;
  golf_script_t *script_local;
  
  fn_val.field_2._8_8_ = golf_alloc_tracked(0x38,"script/eval");
  memset((void *)fn_val.field_2._8_8_,0,0x38);
  *(char **)(fn_val.field_2._8_8_ + 0x30) = "script/eval";
  iVar3 = vec_expand_((char **)&(script->eval).env,&(script->eval).env.length,
                      &(script->eval).env.capacity,8,(script->eval).env.alloc_category);
  if (iVar3 == 0) {
    ppgVar1 = (script->eval).env.data;
    iVar3 = (script->eval).env.length;
    (script->eval).env.length = iVar3 + 1;
    ppgVar1[iVar3] = (gs_env_t *)fn_val.field_2._8_8_;
  }
  _Var2 = golf_script_get_val(script,name,(gs_val_t *)local_48);
  if ((_Var2) && (local_48._0_4_ == GS_VAL_FN)) {
    local_68._0_4_ = fn_val.type;
    local_68._4_1_ = fn_val.is_return;
    local_68._5_3_ = fn_val._5_3_;
    if (num_args == *(int *)(fn_val._0_8_ + 0x28)) {
      for (symbol._4_4_ = 0; symbol._4_4_ < num_args; symbol._4_4_ = symbol._4_4_ + 1) {
        pcStack_90 = *(char **)(*(long *)(local_68 + 0x38) + (long)symbol._4_4_ * 0x18 + 0x10);
        local_94 = *(gs_val_type *)(*(long *)(local_68 + 0x30) + (long)symbol._4_4_ * 4);
        if (local_94 != args[symbol._4_4_].type) {
          gs_val_error(&local_b0,"Invalid arg type");
          __return_storage_ptr__->type = local_b0.type;
          __return_storage_ptr__->is_return = local_b0.is_return;
          *(undefined3 *)&__return_storage_ptr__->field_0x5 = local_b0._5_3_;
          (__return_storage_ptr__->field_2).vec2_val = local_b0.field_2.vec2_val;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_b0.field_2._8_8_;
          goto LAB_00157237;
        }
        pgVar4 = args + symbol._4_4_;
        *(undefined8 *)(fn_val.field_2._8_8_ + 0x18) = *(undefined8 *)pgVar4;
        *(vec2 *)(fn_val.field_2._8_8_ + 0x20) = (pgVar4->field_2).vec2_val;
        *(undefined8 *)(fn_val.field_2._8_8_ + 0x28) = *(undefined8 *)((long)&pgVar4->field_2 + 8);
        map_set_((map_base_t *)fn_val.field_2._8_8_,pcStack_90,(void *)(fn_val.field_2._8_8_ + 0x18)
                 ,0x18,*(char **)(fn_val.field_2._8_8_ + 0x30));
      }
      gs_eval_stmt(&local_c8,&script->eval,*(gs_stmt_t **)(local_68 + 0x40));
      __return_storage_ptr__->type = local_c8.type;
      __return_storage_ptr__->is_return = local_c8.is_return;
      *(undefined3 *)&__return_storage_ptr__->field_0x5 = local_c8._5_3_;
      (__return_storage_ptr__->field_2).vec2_val = local_c8.field_2.vec2_val;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_c8.field_2._8_8_;
    }
    else {
      gs_val_error((gs_val_t *)auStack_80,"Invalid number of args");
      __return_storage_ptr__->type = (gs_val_type)auStack_80;
      __return_storage_ptr__->is_return = i._0_1_;
      *(undefined3 *)&__return_storage_ptr__->field_0x5 = i._1_3_;
      (__return_storage_ptr__->field_2).vec2_val = local_78.vec2_val;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_78._8_8_;
    }
  }
  else {
    gs_val_error((gs_val_t *)&fn_stmt,"Could not find function");
    *(gs_stmt_t **)__return_storage_ptr__ = fn_stmt;
    (__return_storage_ptr__->field_2).vec2_val = local_58.vec2_val;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_58._8_8_;
  }
LAB_00157237:
  (script->eval).env.length = (script->eval).env.length + -1;
  map_deinit_((map_base_t *)fn_val.field_2._8_8_);
  golf_free_tracked((void *)fn_val.field_2._8_8_);
  return __return_storage_ptr__;
}

Assistant:

gs_val_t golf_script_eval_fn(golf_script_t *script, const char *name, gs_val_t *args, int num_args) {
    gs_val_t val;
    gs_env_t *env = golf_alloc_tracked(sizeof(gs_env_t), "script/eval");
    map_init(&env->val_map, "script/eval");
    vec_push(&script->eval.env, env);

    gs_val_t fn_val;
    if (!golf_script_get_val(script, name, &fn_val) || fn_val.type != GS_VAL_FN) {
        val = gs_val_error("Could not find function");
        goto cleanup;
    }

    gs_stmt_t *fn_stmt = (gs_stmt_t*) fn_val.fn_stmt;
    if (num_args != fn_stmt->fn_decl.num_args) {
        val = gs_val_error("Invalid number of args");
        goto cleanup;
    }

    for (int i = 0; i < num_args; i++) {
        const char *symbol = fn_stmt->fn_decl.arg_symbols[i].symbol;
        gs_val_type type = fn_stmt->fn_decl.arg_types[i];
        if (type != args[i].type) {
            val = gs_val_error("Invalid arg type");
            goto cleanup;
        }
        map_set(&env->val_map, symbol, args[i]);
    }

    val = gs_eval_stmt(&script->eval, fn_stmt->fn_decl.body);

cleanup:
    (void)vec_pop(&script->eval.env);
    map_deinit(&env->val_map);
    golf_free(env);
    return val;
}